

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O2

void __thiscall cbtDbvt::update(cbtDbvt *this,cbtDbvtNode *leaf,int lookahead)

{
  cbtDbvtNode *pcVar1;
  int iVar2;
  cbtDbvtNode *root;
  
  pcVar1 = removeleaf(this,leaf);
  if (pcVar1 == (cbtDbvtNode *)0x0) {
    root = (cbtDbvtNode *)0x0;
  }
  else if (lookahead < 0) {
    root = this->m_root;
  }
  else {
    iVar2 = lookahead + 1;
    do {
      root = pcVar1;
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) break;
      pcVar1 = root->parent;
    } while (root->parent != (cbtDbvtNode *)0x0);
  }
  insertleaf(this,root,leaf);
  return;
}

Assistant:

void cbtDbvt::update(cbtDbvtNode* leaf, int lookahead)
{
	cbtDbvtNode* root = removeleaf(this, leaf);
	if (root)
	{
		if (lookahead >= 0)
		{
			for (int i = 0; (i < lookahead) && root->parent; ++i)
			{
				root = root->parent;
			}
		}
		else
			root = m_root;
	}
	insertleaf(this, root, leaf);
}